

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Lf_Cut_t * Lf_ManFetchSet(Lf_Man_t *p,int i)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  void *pvVar3;
  void **ppvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if ((i < 0) || (p->pGia->nObjs <= i)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (i < (p->vOffsets).nSize) {
    iVar7 = (p->vOffsets).pArray[(uint)i];
    lVar9 = (long)iVar7;
    if ((-1 < lVar9) && (iVar7 < (p->vCutSets).nSize)) {
      pGVar2 = p->pGia->pObjs + (uint)i;
      uVar5 = (uint)*(undefined8 *)pGVar2;
      if ((((int)uVar5 < 0) || ((uVar5 & 0x1fffffff) == 0x1fffffff)) ||
         ((((uint)((ulong)*(undefined8 *)pGVar2 >> 0x20) ^ uVar5) & 0x1fffffff) == 0)) {
        __assert_fail("Gia_ObjIsAndNotBuf(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                      ,0x171,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
      }
      if (pGVar2->Value == 0) {
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                      ,0x172,"Lf_Cut_t *Lf_ManFetchSet(Lf_Man_t *, int)");
      }
      uVar5 = (p->vCutSets).pArray[lVar9];
      if (uVar5 == 0xffffffff) {
        iVar1 = (p->vFreeSets).nSize;
        if (iVar1 == 0) {
          pvVar3 = calloc((long)p->nSetWords << 0xc,8);
          uVar5 = (p->vMemSets).nSize;
          if (uVar5 == (p->vMemSets).nCap) {
            if ((int)uVar5 < 0x10) {
              ppvVar4 = (p->vMemSets).pArray;
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc(0x80);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,0x80);
              }
              (p->vMemSets).pArray = ppvVar4;
              (p->vMemSets).nCap = 0x10;
            }
            else {
              ppvVar4 = (p->vMemSets).pArray;
              if (ppvVar4 == (void **)0x0) {
                ppvVar4 = (void **)malloc((ulong)uVar5 << 4);
              }
              else {
                ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar5 << 4);
              }
              (p->vMemSets).pArray = ppvVar4;
              (p->vMemSets).nCap = uVar5 * 2;
            }
          }
          else {
            ppvVar4 = (p->vMemSets).pArray;
          }
          iVar1 = (p->vMemSets).nSize;
          (p->vMemSets).nSize = iVar1 + 1;
          ppvVar4[iVar1] = pvVar3;
          lVar8 = 0x17ffc;
          uVar6 = 0xfff;
          do {
            Vec_IntPush(&p->vFreeSets,uVar5 << 0xc | uVar6);
            *(undefined1 *)((long)pvVar3 + lVar8 + 3) = 0xff;
            lVar8 = lVar8 + -0x18;
            uVar6 = uVar6 - 1;
          } while (lVar8 != -4);
          iVar1 = (p->vFreeSets).nSize;
        }
        if (iVar1 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x396,"int Vec_IntPop(Vec_Int_t *)");
        }
        (p->vFreeSets).nSize = iVar1 - 1U;
        if ((p->vCutSets).nSize <= iVar7) {
LAB_006dabbc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (p->vFreeSets).pArray[iVar1 - 1U];
        (p->vCutSets).pArray[lVar9] = uVar5;
        iVar7 = uVar5 + 1;
        if ((int)(uVar5 + 1) < p->nFrontMax) {
          iVar7 = p->nFrontMax;
        }
        p->nFrontMax = iVar7;
      }
      else {
        uVar6 = pGVar2->Value - 1;
        pGVar2->Value = uVar6;
        if (uVar6 == 0) {
          Vec_IntPush(&p->vFreeSets,uVar5);
          if ((p->vCutSets).nSize <= iVar7) goto LAB_006dabbc;
          (p->vCutSets).pArray[lVar9] = -1;
        }
      }
      uVar6 = (int)uVar5 >> 0xc;
      if ((-1 < (int)uVar6) && ((int)uVar6 < (p->vMemSets).nSize)) {
        return (Lf_Cut_t *)
               ((ulong)(uVar5 & 0xfff) * (long)p->nSetWords * 8 + (long)(p->vMemSets).pArray[uVar6])
        ;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline Lf_Cut_t * Lf_ManFetchSet( Lf_Man_t * p, int i )
{
    int uMaskPage = (1 << LF_LOG_PAGE) - 1;
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, i );
    int iOffSet = Vec_IntEntry( &p->vOffsets, i );
    int Entry = Vec_IntEntry( &p->vCutSets, iOffSet );
    assert( Gia_ObjIsAndNotBuf(pObj) );
    assert( pObj->Value > 0 );
    if ( Entry == -1 ) // first visit
    {
        if ( Vec_IntSize(&p->vFreeSets) == 0 ) // add new
        {
            Lf_Cut_t * pCut = (Lf_Cut_t *)ABC_CALLOC( word, p->nSetWords * (1 << LF_LOG_PAGE) );
            int uMaskShift = Vec_PtrSize(&p->vMemSets) << LF_LOG_PAGE;
            Vec_PtrPush( &p->vMemSets, pCut );
            for ( Entry = uMaskPage; Entry >= 0; Entry-- )
            {
                Vec_IntPush( &p->vFreeSets, uMaskShift | Entry );
                pCut[Entry].nLeaves   = LF_NO_LEAF;
            }
        }
        Entry = Vec_IntPop( &p->vFreeSets );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, Entry );
        p->nFrontMax = Abc_MaxInt( p->nFrontMax, Entry + 1 );
    }
    else if ( --pObj->Value == 0 )
    {
        Vec_IntPush( &p->vFreeSets, Entry );
        Vec_IntWriteEntry( &p->vCutSets, iOffSet, -1 );
    }
    return (Lf_Cut_t *)((word *)Vec_PtrEntry(&p->vMemSets, Entry >> LF_LOG_PAGE) + p->nSetWords * (Entry & uMaskPage));
}